

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void c4::afree(void *ptr)

{
  bool bVar1;
  error_flags eVar2;
  afree_pfn p_Var3;
  void *in_RDI;
  afree_pfn fn;
  
  p_Var3 = get_afree();
  if (p_Var3 == (afree_pfn)0x0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x347f4b,(char *)0x441f,
                 "check failed: c4::get_afree() != nullptr\ndid you forget to call set_afree()?");
  }
  p_Var3 = get_afree();
  (*p_Var3)(in_RDI);
  return;
}

Assistant:

void afree(void* ptr)
{
    C4_ASSERT_MSG(c4::get_afree() != nullptr, "did you forget to call set_afree()?");
    auto fn = c4::get_afree();
    fn(ptr);
}